

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O3

void EDLines::EnumerateRectPoints
               (double sx,double sy,double ex,double ey,int *ptsx,int *ptsy,int *pNoPoints)

{
  double dVar1;
  double dVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  undefined4 unaff_R12D;
  int iVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  double dVar16;
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  double dVar20;
  double vy [4];
  double vx [4];
  double local_b8 [4];
  double local_98 [4];
  undefined1 local_78 [16];
  double local_68;
  double dStack_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  dVar20 = ex - sx;
  dVar18 = ey - sy;
  dVar19 = SQRT(dVar20 * dVar20 + dVar18 * dVar18);
  dVar20 = dVar20 / dVar19;
  dVar18 = dVar18 / dVar19;
  dVar19 = (dVar18 + dVar18) * 0.5;
  dVar18 = (dVar20 + dVar20) * 0.5;
  local_58._8_4_ = SUB84(ex - dVar19,0);
  local_58._0_8_ = sx - dVar19;
  local_58._12_4_ = (int)((ulong)(ex - dVar19) >> 0x20);
  local_78._8_4_ = SUB84(ey + dVar18,0);
  local_78._0_8_ = sy + dVar18;
  local_78._12_4_ = (int)((ulong)(ey + dVar18) >> 0x20);
  local_48._8_4_ = SUB84(sx + dVar19,0);
  local_48._0_8_ = ex + dVar19;
  local_48._12_4_ = (int)((ulong)(sx + dVar19) >> 0x20);
  local_68 = ey - dVar18;
  dStack_60 = sy - dVar18;
  if ((ex <= sx) || (ey < sy)) {
    if ((sx < ex) || (iVar6 = 1, ey <= sy)) {
      iVar6 = (sx <= ex || sy < ey) + 2;
    }
  }
  else {
    iVar6 = 0;
  }
  lVar3 = 0;
  do {
    uVar4 = (iVar6 + (int)lVar3 & 3U) << 3;
    local_98[lVar3] = *(double *)(local_58 + uVar4);
    local_b8[lVar3] = *(double *)(local_78 + uVar4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  dVar19 = ceil(local_b8[0]);
  dVar2 = local_98[2];
  dVar20 = local_98[1];
  iVar6 = (int)dVar19;
  dVar19 = local_98[2] - local_98[3];
  dVar18 = ceil(local_98[0]);
  iVar5 = (int)dVar18 + -1;
  auVar17._4_4_ = -(uint)(0.01 < ABS(dVar20 - local_98[2]));
  auVar17._0_4_ = -(uint)(0.01 < ABS(local_98[0] - local_98[1]));
  auVar17._8_4_ = -(uint)(0.01 < ABS(local_98[0] - local_98[3]));
  auVar17._12_4_ = -(uint)(0.01 < ABS(local_98[3] - dVar2));
  uVar4 = movmskps(unaff_R12D,auVar17);
  uVar10 = (undefined4)((ulong)local_b8[3] >> 0x20);
  uVar14 = (undefined4)((ulong)local_b8[2] >> 0x20);
  uVar7 = SUB84(local_b8[3],0);
  uVar11 = uVar10;
  if (local_b8[2] <= local_b8[3]) {
    uVar7 = SUB84(local_b8[2],0);
    uVar11 = uVar14;
  }
  uVar12 = (undefined4)((ulong)local_b8[0] >> 0x20);
  uVar8 = SUB84(local_b8[0],0);
  uVar13 = uVar12;
  if (local_b8[3] <= local_b8[0]) {
    uVar8 = SUB84(local_b8[3],0);
    uVar13 = uVar10;
  }
  uVar15 = (undefined4)((ulong)local_b8[1] >> 0x20);
  uVar10 = SUB84(local_b8[2],0);
  if (local_b8[2] <= local_b8[1]) {
    uVar10 = SUB84(local_b8[1],0);
    uVar14 = uVar15;
  }
  uVar9 = SUB84(local_b8[1],0);
  if (local_b8[1] <= local_b8[0]) {
    uVar9 = SUB84(local_b8[0],0);
    uVar15 = uVar12;
  }
  dVar18 = -1.79769313486232e+308;
  lVar3 = 0;
  do {
    iVar6 = iVar6 + 1;
    dVar16 = (double)iVar5;
    if ((dVar18 < (double)iVar6) && (dVar16 <= dVar2)) {
      while( true ) {
        iVar5 = iVar5 + 1;
        dVar16 = (double)iVar5;
        if (dVar2 < dVar16) break;
        if (local_98[3] <= dVar16) {
          if ((byte)((byte)uVar4 >> 3) == 0) {
            dVar1 = (double)CONCAT44(uVar11,uVar7);
            if (local_b8[3] != local_b8[2]) goto LAB_00118c3f;
            dVar18 = (dVar16 - local_98[3]) * (ey - local_b8[3]);
          }
          else {
            dVar18 = (dVar16 - local_98[3]) * (local_b8[2] - local_b8[3]);
          }
          dVar1 = dVar18 / dVar19 + local_b8[3];
        }
        else if (((uVar4 & 4) != 0) ||
                (dVar1 = (double)CONCAT44(uVar13,uVar8), local_b8[0] == local_b8[3])) {
          dVar1 = ((dVar16 - local_98[0]) * (local_b8[3] - local_b8[0])) /
                  (local_98[3] - local_98[0]) + local_b8[0];
        }
LAB_00118c3f:
        if (dVar20 <= dVar16) {
          if (((uVar4 & 2) != 0) ||
             (dVar18 = (double)CONCAT44(uVar14,uVar10), local_b8[1] == local_b8[2])) {
            dVar18 = ((dVar16 - dVar20) * (local_b8[2] - local_b8[1])) / (dVar2 - dVar20) +
                     local_b8[1];
          }
        }
        else if (((uVar4 & 1) != 0) ||
                (dVar18 = (double)CONCAT44(uVar15,uVar9), local_b8[0] == local_b8[1])) {
          dVar18 = ((dVar16 - local_98[0]) * (local_b8[1] - local_b8[0])) / (dVar20 - local_98[0]) +
                   local_b8[0];
        }
        dVar1 = ceil(dVar1);
        iVar6 = (int)dVar1;
        if (((double)(int)dVar1 <= dVar18) || (dVar2 < dVar16)) break;
      }
    }
    if (dVar2 < dVar16) {
      *pNoPoints = (int)lVar3;
      return;
    }
    ptsx[lVar3] = iVar5;
    ptsy[lVar3] = iVar6;
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

void EDLines::EnumerateRectPoints(double sx, double sy, double ex, double ey, int ptsx[], int ptsy[], int * pNoPoints)
{
	double vxTmp[4], vyTmp[4];
	double vx[4], vy[4];
	int n, offset;

	double x1 = sx;
	double y1 = sy;
	double x2 = ex;
	double y2 = ey;
	double width = 2;

	double dx = x2 - x1;
	double dy = y2 - y1;
	double vLen = sqrt(dx*dx + dy*dy);

	// make unit vector
	dx = dx / vLen;
	dy = dy / vLen;

	/* build list of rectangle corners ordered
	in a circular way around the rectangle */
	vxTmp[0] = x1 - dy * width / 2.0;
	vyTmp[0] = y1 + dx * width / 2.0;
	vxTmp[1] = x2 - dy * width / 2.0;
	vyTmp[1] = y2 + dx * width / 2.0;
	vxTmp[2] = x2 + dy * width / 2.0;
	vyTmp[2] = y2 - dx * width / 2.0;
	vxTmp[3] = x1 + dy * width / 2.0;
	vyTmp[3] = y1 - dx * width / 2.0;

	/* compute rotation of index of corners needed so that the first
	point has the smaller x.

	if one side is vertical, thus two corners have the same smaller x
	value, the one with the largest y value is selected as the first.
	*/
	if (x1 < x2 && y1 <= y2) offset = 0;
	else if (x1 >= x2 && y1 < y2) offset = 1;
	else if (x1 > x2 && y1 >= y2) offset = 2;
	else                          offset = 3;

	/* apply rotation of index. */
	for (n = 0; n<4; n++) {
		vx[n] = vxTmp[(offset + n) % 4];
		vy[n] = vyTmp[(offset + n) % 4];
	} //end-for

	  /* Set a initial condition.

	  The values are set to values that will cause 'ri_inc' (that will
	  be called immediately) to initialize correctly the first 'column'
	  and compute the limits 'ys' and 'ye'.

	  'y' is set to the integer value of vy[0], the starting corner.

	  'ys' and 'ye' are set to very small values, so 'ri_inc' will
	  notice that it needs to start a new 'column'.

	  The smaller integer coordinate inside of the rectangle is
	  'ceil(vx[0])'. The current 'x' value is set to that value minus
	  one, so 'ri_inc' (that will increase x by one) will advance to
	  the first 'column'.
	  */
	int x = (int)ceil(vx[0]) - 1;
	int y = (int)ceil(vy[0]);
	double ys = -DBL_MAX, ye = -DBL_MAX;

	int noPoints = 0;
	while (1) {
		/* if not at end of exploration,
		increase y value for next pixel in the 'column' */
		y++;

		/* if the end of the current 'column' is reached,
		and it is not the end of exploration,
		advance to the next 'column' */
		while (y > ye && x <= vx[2]) {
			/* increase x, next 'column' */
			x++;

			/* if end of exploration, return */
			if (x > vx[2]) break;

			/* update lower y limit (start) for the new 'column'.

			We need to interpolate the y value that corresponds to the
			lower side of the rectangle. The first thing is to decide if
			the corresponding side is

			vx[0],vy[0] to vx[3],vy[3] or
			vx[3],vy[3] to vx[2],vy[2]

			Then, the side is interpolated for the x value of the
			'column'. But, if the side is vertical (as it could happen if
			the rectangle is vertical and we are dealing with the first
			or last 'columns') then we pick the lower value of the side
			by using 'inter_low'.
			*/
			if ((double)x < vx[3]) {
				/* interpolation */
				if (fabs(vx[0] - vx[3]) <= 0.01) {
					if (vy[0]<vy[3]) ys = vy[0];
					else if (vy[0]>vy[3]) ys = vy[3];
					else     ys = vy[0] + (x - vx[0]) * (vy[3] - vy[0]) / (vx[3] - vx[0]);
				}
				else
					ys = vy[0] + (x - vx[0]) * (vy[3] - vy[0]) / (vx[3] - vx[0]);

			}
			else {
				/* interpolation */
				if (fabs(vx[3] - vx[2]) <= 0.01) {
					if (vy[3]<vy[2]) ys = vy[3];
					else if (vy[3]>vy[2]) ys = vy[2];
					else     ys = vy[3] + (x - vx[3]) * (y2 - vy[3]) / (vx[2] - vx[3]);
				}
				else
					ys = vy[3] + (x - vx[3]) * (vy[2] - vy[3]) / (vx[2] - vx[3]);
			} //end-else

			  /* update upper y limit (end) for the new 'column'.

			  We need to interpolate the y value that corresponds to the
			  upper side of the rectangle. The first thing is to decide if
			  the corresponding side is

			  vx[0],vy[0] to vx[1],vy[1] or
			  vx[1],vy[1] to vx[2],vy[2]

			  Then, the side is interpolated for the x value of the
			  'column'. But, if the side is vertical (as it could happen if
			  the rectangle is vertical and we are dealing with the first
			  or last 'columns') then we pick the lower value of the side
			  by using 'inter_low'.
			  */
			if ((double)x < vx[1]) {
				/* interpolation */
				if (fabs(vx[0] - vx[1]) <= 0.01) {
					if (vy[0]<vy[1]) ye = vy[1];
					else if (vy[0]>vy[1]) ye = vy[0];
					else     ye = vy[0] + (x - vx[0]) * (vy[1] - vy[0]) / (vx[1] - vx[0]);
				}
				else
					ye = vy[0] + (x - vx[0]) * (vy[1] - vy[0]) / (vx[1] - vx[0]);

			}
			else {
				/* interpolation */
				if (fabs(vx[1] - vx[2]) <= 0.01) {
					if (vy[1]<vy[2]) ye = vy[2];
					else if (vy[1]>vy[2]) ye = vy[1];
					else     ye = vy[1] + (x - vx[1]) * (vy[2] - vy[1]) / (vx[2] - vx[1]);
				}
				else
					ye = vy[1] + (x - vx[1]) * (vy[2] - vy[1]) / (vx[2] - vx[1]);
			} //end-else

			  /* new y */
			y = (int)ceil(ys);
		} //end-while

		  // Are we done?
		if (x > vx[2]) break;

		ptsx[noPoints] = x;
		ptsy[noPoints] = y;
		noPoints++;
	} //end-while

	*pNoPoints = noPoints;
}